

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

TCGv_i64 read_cpu_reg_sp_aarch64(DisasContext_conflict1 *s,int reg,int sf)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 arg;
  TCGv_i64 ret;
  uintptr_t o_1;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  ret = new_tmp_a64_aarch64(s);
  arg = tcg_ctx->cpu_X[reg];
  if (sf == 0) {
    tcg_gen_ext32u_i64_aarch64(tcg_ctx,ret,arg);
  }
  else if (ret != arg) {
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(ret + (long)tcg_ctx),
                        (TCGArg)(arg + (long)tcg_ctx));
  }
  return ret;
}

Assistant:

TCGv_i64 read_cpu_reg_sp(DisasContext *s, int reg, int sf)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 v = new_tmp_a64(s);
    if (sf) {
        tcg_gen_mov_i64(tcg_ctx, v, tcg_ctx->cpu_X[reg]);
    } else {
        tcg_gen_ext32u_i64(tcg_ctx, v, tcg_ctx->cpu_X[reg]);
    }
    return v;
}